

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_rotli_i64_ppc(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,uint arg2)

{
  TCGv_i64 arg2_00;
  TCGv_i64 t0;
  uint arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  if (arg2 == 0) {
    tcg_gen_mov_i64_ppc(tcg_ctx,ret,arg1);
  }
  else {
    arg2_00 = tcg_const_i64_ppc(tcg_ctx,(ulong)arg2);
    tcg_gen_rotl_i64_ppc(tcg_ctx,ret,arg1,arg2_00);
    tcg_temp_free_i64(tcg_ctx,arg2_00);
  }
  return;
}

Assistant:

void tcg_gen_rotli_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, unsigned arg2)
{
    tcg_debug_assert(arg2 < 64);
    /* some cases can be optimized here */
    if (arg2 == 0) {
        tcg_gen_mov_i64(tcg_ctx, ret, arg1);
    } else {
#if TCG_TARGET_HAS_rot_i64
        TCGv_i64 t0 = tcg_const_i64(tcg_ctx, arg2);
        tcg_gen_rotl_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
#else
        TCGv_i64 t0, t1;
        t0 = tcg_temp_new_i64(tcg_ctx);
        t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_shli_i64(tcg_ctx, t0, arg1, arg2);
        tcg_gen_shri_i64(tcg_ctx, t1, arg1, 64 - arg2);
        tcg_gen_or_i64(tcg_ctx, ret, t0, t1);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
#endif
    }
}